

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteUint64(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,uint64_t u)

{
  Ch *buffer_00;
  char *pcVar1;
  char *end;
  char *buffer;
  uint64_t u_local;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  buffer_00 = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Push
                        (this->os_,0x14);
  pcVar1 = internal::u64toa(u,buffer_00);
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Pop
            (this->os_,0x14 - ((long)pcVar1 - (long)buffer_00));
  return true;
}

Assistant:

inline bool Writer<StringBuffer>::WriteUint64(uint64_t u) {
    char *buffer = os_->Push(20);
    const char* end = internal::u64toa(u, buffer);
    os_->Pop(static_cast<size_t>(20 - (end - buffer)));
    return true;
}